

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_byte(lua_State *L)

{
  uint space;
  char *pcVar1;
  lua_Integer def;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t l;
  ulong local_30;
  
  pcVar1 = luaL_checklstring(L,1,&local_30);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (local_30 < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + local_30 + 1;
    }
  }
  uVar2 = luaL_optinteger(L,3,def);
  if ((long)uVar2 < 0) {
    if (local_30 < -uVar2) {
      uVar2 = 0;
    }
    else {
      uVar2 = uVar2 + local_30 + 1;
    }
  }
  uVar4 = def + (ulong)(def == 0);
  if (uVar2 < local_30) {
    local_30 = uVar2;
  }
  space = 0;
  if (uVar4 <= local_30) {
    uVar3 = (int)local_30 - (int)uVar4;
    space = uVar3 + 1;
    if (local_30 < (long)(int)space + uVar4) {
      luaL_checkstack(L,space,"string slice too long");
      if (uVar3 < 0x7fffffff) {
        uVar2 = 0;
        do {
          lua_pushinteger(L,(ulong)(byte)pcVar1[uVar2 + (uVar4 - 1)]);
          uVar2 = uVar2 + 1;
        } while (space != uVar2);
      }
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t posi = posrelat(luaL_optinteger(L, 2, 1), l);
  size_t pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi < 1) posi = 1;
  if (pose > l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  n = (int)(pose -  posi + 1);
  if (posi + n <= pose)  /* (size_t -> int) overflow? */
    return luaL_error(L, "string slice too long");
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}